

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Chapters::Atom::Parse(Atom *this,IMkvReader *pReader,longlong pos,longlong size)

{
  IMkvReader *in_RCX;
  long in_RDX;
  long in_RDI;
  longlong val_2;
  longlong val_1;
  longlong val;
  long status;
  longlong size_1;
  longlong id;
  longlong stop;
  longlong in_stack_ffffffffffffffa0;
  longlong *in_stack_ffffffffffffffa8;
  IMkvReader *in_stack_ffffffffffffffb0;
  Atom *in_stack_ffffffffffffffb8;
  char **in_stack_ffffffffffffffc0;
  IMkvReader *in_stack_ffffffffffffffc8;
  longlong pos_00;
  long local_20;
  
  pos_00 = (long)&in_RCX->_vptr_IMkvReader + in_RDX;
  local_20 = in_RDX;
  do {
    do {
      if (pos_00 <= local_20) {
        if (local_20 != pos_00) {
          return -2;
        }
        return 0;
      }
      in_stack_ffffffffffffffb8 =
           (Atom *)ParseElementHeader(in_stack_ffffffffffffffc8,
                                      (longlong *)in_stack_ffffffffffffffc0,
                                      (longlong)in_stack_ffffffffffffffb8,
                                      (longlong *)in_stack_ffffffffffffffb0,
                                      in_stack_ffffffffffffffa8);
      if ((long)in_stack_ffffffffffffffb8 < 0) {
        return (long)in_stack_ffffffffffffffb8;
      }
    } while (in_stack_ffffffffffffffc0 == (char **)0x0);
    if (in_stack_ffffffffffffffc8 == (IMkvReader *)0x80) {
      in_stack_ffffffffffffffb8 =
           (Atom *)ParseDisplay(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                (longlong)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
joined_r0x001971a6:
      if ((long)in_stack_ffffffffffffffb8 < 0) {
        return (long)in_stack_ffffffffffffffb8;
      }
    }
    else {
      if (in_stack_ffffffffffffffc8 == (IMkvReader *)0x5654) {
        in_stack_ffffffffffffffb8 =
             (Atom *)UnserializeString(in_RCX,pos_00,0x5654,in_stack_ffffffffffffffc0);
        goto joined_r0x001971a6;
      }
      if (in_stack_ffffffffffffffc8 == (IMkvReader *)0x73c4) {
        in_stack_ffffffffffffffb8 =
             (Atom *)UnserializeInt(in_RCX,pos_00,0x73c4,(longlong *)in_stack_ffffffffffffffc0);
        if ((long)in_stack_ffffffffffffffb8 < 0) {
          return (long)in_stack_ffffffffffffffb8;
        }
        *(IMkvReader **)(in_RDI + 8) = in_stack_ffffffffffffffb0;
      }
      else if (in_stack_ffffffffffffffc8 == (IMkvReader *)0x91) {
        in_stack_ffffffffffffffa8 =
             (longlong *)
             UnserializeUInt((IMkvReader *)0x91,(longlong)in_stack_ffffffffffffffc0,
                             (longlong)in_stack_ffffffffffffffb8);
        if ((long)in_stack_ffffffffffffffa8 < 0) {
          return (long)in_stack_ffffffffffffffa8;
        }
        *(longlong **)(in_RDI + 0x10) = in_stack_ffffffffffffffa8;
      }
      else if (in_stack_ffffffffffffffc8 == (IMkvReader *)0x92) {
        in_stack_ffffffffffffffa0 =
             UnserializeUInt((IMkvReader *)0x92,(longlong)in_stack_ffffffffffffffc0,
                             (longlong)in_stack_ffffffffffffffb8);
        if (in_stack_ffffffffffffffa0 < 0) {
          return in_stack_ffffffffffffffa0;
        }
        *(longlong *)(in_RDI + 0x18) = in_stack_ffffffffffffffa0;
      }
    }
    local_20 = (long)in_stack_ffffffffffffffc0 + local_20;
    if (pos_00 < local_20) {
      return -2;
    }
  } while( true );
}

Assistant:

long Chapters::Atom::Parse(IMkvReader* pReader, long long pos, long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // 0 length payload, skip.
      continue;

    if (id == libwebm::kMkvChapterDisplay) {
      status = ParseDisplay(pReader, pos, size);

      if (status < 0)  // error
        return status;
    } else if (id == libwebm::kMkvChapterStringUID) {
      status = UnserializeString(pReader, pos, size, m_string_uid);

      if (status < 0)  // error
        return status;
    } else if (id == libwebm::kMkvChapterUID) {
      long long val;
      status = UnserializeInt(pReader, pos, size, val);

      if (status < 0)  // error
        return status;

      m_uid = static_cast<unsigned long long>(val);
    } else if (id == libwebm::kMkvChapterTimeStart) {
      const long long val = UnserializeUInt(pReader, pos, size);

      if (val < 0)  // error
        return static_cast<long>(val);

      m_start_timecode = val;
    } else if (id == libwebm::kMkvChapterTimeEnd) {
      const long long val = UnserializeUInt(pReader, pos, size);

      if (val < 0)  // error
        return static_cast<long>(val);

      m_stop_timecode = val;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}